

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O0

double __thiscall libDAI::NDP::run(NDP *this)

{
  ostream *poVar1;
  ulong uVar2;
  Exception *this_00;
  long lVar3;
  undefined8 uVar4;
  void *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar5;
  double val;
  double timeSpentInS;
  clock_t utime;
  size_t i;
  tms ts_after;
  tms ts_before;
  FactorGraph *g;
  size_t in_stack_00000648;
  NDP *in_stack_00000650;
  string *in_stack_ffffffffffffff20;
  ostream *in_stack_ffffffffffffff28;
  NDP *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff60;
  ulong local_88;
  tms local_80;
  long local_60;
  NDP *in_stack_ffffffffffffffb0;
  string local_30 [32];
  long *local_10;
  
  local_10 = (long *)(**(code **)(*(long *)in_RDI + 0x20))();
  in_RDI[0xe]._M_string_length = 0xfff0000000000000;
  if (1 < *(ulong *)((long)&in_RDI[8].field_2 + 8)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Starting ");
    in_stack_ffffffffffffff20 = local_30;
    (**(code **)(*(long *)in_RDI + 0x48))();
    in_stack_ffffffffffffff28 = std::operator<<(poVar1,in_stack_ffffffffffffff20);
    poVar1 = std::operator<<(in_stack_ffffffffffffff28,"...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_30);
  }
  if (2 < *(ulong *)((long)&in_RDI[8].field_2 + 8)) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  times((tms *)&local_60);
  ComputeHeuristicVariableOrdering(in_stack_ffffffffffffffb0);
  local_88 = 0;
  do {
    uVar2 = (**(code **)(*local_10 + 0x28))();
    if (uVar2 <= local_88) {
      dVar5 = ConstructOptimalAssignments(in_stack_ffffffffffffff50);
      if (*(long *)((long)&in_RDI[8].field_2 + 8) != 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"NDP done. Induced width was ");
        this_01 = (void *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 9));
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      }
      return dVar5;
    }
    if (0.0 < *(double *)(in_RDI + 10)) {
      times(&local_80);
      this_00 = (Exception *)(local_80.tms_utime - local_60);
      dVar5 = (double)(long)this_00;
      lVar3 = sysconf(2);
      dVar5 = dVar5 / (double)lVar3;
      if (*(double *)(in_RDI + 10) < dVar5) {
        uVar4 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_RDI,(char *)in_stack_ffffffffffffff28,
                   (allocator<char> *)in_stack_ffffffffffffff20);
        Exception::Exception(this_00,(size_t)dVar5,in_stack_ffffffffffffff60);
        __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
      }
    }
    EliminateVariable(in_stack_00000650,in_stack_00000648);
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

double NDP::run() {
        const FactorGraph& g = grm();
        bestValue = -INFINITY;
        if( Props.verbose >= 2 )
            cout << "Starting " << identify() << "..."<<endl;
        if( Props.verbose >= 3)
           cout << endl; 

        tms ts_before, ts_after;
        times(&ts_before);

        //struct timeval start_time, cur_time;
        //if(gettimeofday(&start_time, NULL) != 0)
            //throw "Error with gettimeofday";
        //clock_t tic = toc();

        // 0) some initialization

        // 1) create a heuristic ordering of the variables to eliminate
        ComputeHeuristicVariableOrdering();
        
        // 2) eliminate the variables one by one
        for(size_t i=0; i < g.nrVars(); i++)
        {
            // make sure we don't use too much time
            if(_m_deadlineInSeconds>0)
            {
                times(&ts_after);
                clock_t utime = ts_after.tms_utime -
                    ts_before.tms_utime;
                double timeSpentInS=static_cast<double>(utime) / sysconf(_SC_CLK_TCK);
                if(timeSpentInS>_m_deadlineInSeconds)
                    DAI_THROW(INTERNAL_ERROR);
            }
            EliminateVariable(i);
        }
        // 3) construct the k optimal assignments
        double val = ConstructOptimalAssignments();
        if(Props.verbose >= 1)
            cout << "NDP done. Induced width was "<<_m_induced_width<<endl;
        
        return(val);
    }